

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleExportAndroidMKMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCommandArgumentGroup *group;
  pointer pbVar1;
  char *destination;
  char *file_permissions;
  char *component;
  bool bVar2;
  int iVar3;
  MessageLevel message;
  ostream *poVar4;
  string *psVar5;
  long lVar6;
  cmGlobalGenerator *pcVar7;
  cmExportSet *exportSet;
  cmInstallExportGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  string fname;
  string local_828;
  string local_808;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  ostringstream e;
  ios_base local_748 [264];
  cmCAString exp;
  cmCAString filename;
  cmCAString name_space;
  cmCAEnabler exportOld;
  cmInstallCommandArguments ica;
  
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&this->DefaultComponentName);
  cmCAString::cmCAString(&exp,&ica.Parser,"EXPORT_ANDROID_MK",(cmCommandArgumentGroup *)0x0);
  group = &ica.ArgumentGroup;
  cmCAString::cmCAString(&name_space,&ica.Parser,"NAMESPACE",group);
  cmCAEnabler::cmCAEnabler(&exportOld,&ica.Parser,"EXPORT_LINK_INTERFACE_LIBRARIES",group);
  cmCAString::cmCAString(&filename,&ica.Parser,"FILE",group);
  cmCommandArgument::Follows(&exp.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(group,&exp.super_cmCommandArgument);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmInstallCommandArguments::Parse(&ica,args,&unknownArgs);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar2) {
      psVar5 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar5->_M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," given no DESTINATION!",0x16);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&fname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fname._M_dataplus._M_p != &fname.field_2) {
          operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0034f508;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename.String._M_dataplus._M_p,
                 filename.String._M_dataplus._M_p + filename.String._M_string_length);
      lVar6 = std::__cxx11::string::find_first_of((char *)&fname,0x55bf6d,0);
      if (lVar6 == -1) {
        if (fname._M_string_length == 0) {
          bVar2 = false;
        }
        else {
          cmsys::SystemTools::GetFilenameLastExtension(&local_808,&fname);
          iVar3 = std::__cxx11::string::compare((char *)&local_808);
          bVar2 = iVar3 != 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_808._M_dataplus._M_p != &local_808.field_2) {
            operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," given invalid export file name \"",0x21);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,fname._M_dataplus._M_p,fname._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"The FILE argument must specify a name ending in \".mk\".",0x36);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_828);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_828._M_dataplus._M_p != &local_828.field_2) {
            operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0034f9e0;
        }
        lVar6 = std::__cxx11::string::find_first_of((char *)&fname,0x55bf6d,0);
        if (lVar6 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," given export name \"",0x14);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,exp.String._M_dataplus._M_p,exp.String._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"This name cannot be safely converted to a file name.  ",0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"Specify a different export name or use the FILE option to set ",0x3e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"a file name explicitly.",0x17);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_828);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_828._M_dataplus._M_p != &local_828.field_2) {
            operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0034f9e0;
        }
        if (fname._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)&fname,"Android.mk");
        }
        pcVar7 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        exportSet = cmExportSetMap::operator[](&pcVar7->ExportSets,&exp.String);
        message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
        this_00 = (cmInstallExportGenerator *)operator_new(0x178);
        psVar5 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        destination = (psVar5->_M_dataplus)._M_p;
        psVar5 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        file_permissions = (psVar5->_M_dataplus)._M_p;
        configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        psVar5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        component = (psVar5->_M_dataplus)._M_p;
        bVar2 = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        cmInstallExportGenerator::cmInstallExportGenerator
                  (this_00,exportSet,destination,file_permissions,configurations,component,message,
                   bVar2,fname._M_dataplus._M_p,name_space.String._M_dataplus._M_p,exportOld.Enabled
                   ,true);
        bVar2 = true;
        cmMakefile::AddInstallGenerator
                  ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_00);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," given invalid export file name \"",0x21);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,fname._M_dataplus._M_p,fname._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".  ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"The FILE argument may not contain a path.  ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Specify the path in the DESTINATION argument.",0x2d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_808);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_808._M_dataplus._M_p != &local_808.field_2) {
          operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
        }
LAB_0034f9e0:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_748);
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0034f66c;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," given unknown argument \"",0x19);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,((unknownArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (unknownArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&fname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
    }
LAB_0034f508:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_748);
  }
  bVar2 = false;
LAB_0034f66c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  filename.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_006723c0
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename.String._M_dataplus._M_p != &filename.String.field_2) {
    operator_delete(filename.String._M_dataplus._M_p,
                    filename.String.field_2._M_allocated_capacity + 1);
  }
  filename.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0066cdb8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&filename.super_cmCommandArgument.ArgumentsBefore._M_t);
  exportOld.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0066cdb8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exportOld.super_cmCommandArgument.ArgumentsBefore._M_t);
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_006723c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space.String._M_dataplus._M_p != &name_space.String.field_2) {
    operator_delete(name_space.String._M_dataplus._M_p,
                    name_space.String.field_2._M_allocated_capacity + 1);
  }
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0066cdb8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&name_space.super_cmCommandArgument.ArgumentsBefore._M_t);
  exp.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_006723c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp.String._M_dataplus._M_p != &exp.String.field_2) {
    operator_delete(exp.String._M_dataplus._M_p,exp.String.field_2._M_allocated_capacity + 1);
  }
  exp.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_0066cdb8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exp.super_cmCommandArgument.ArgumentsBefore._M_t);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  return bVar2;
}

Assistant:

bool cmInstallCommand::HandleExportAndroidMKMode(
  std::vector<std::string> const& args)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT_ANDROID_MK");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(CM_NULLPTR);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Check the file name.
  std::string fname = filename.GetString();
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".mk") {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".mk\".";
    this->SetError(e.str());
    return false;
  }
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given export name \"" << exp.GetString() << "\".  "
      << "This name cannot be safely converted to a file name.  "
      << "Specify a different export name or use the FILE option to set "
      << "a file name explicitly.";
    this->SetError(e.str());
    return false;
  }
  // Use the default name
  if (fname.empty()) {
    fname = "Android.mk";
  }

  cmExportSet* exportSet =
    this->Makefile->GetGlobalGenerator()->GetExportSets()[exp.GetString()];

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator = new cmInstallExportGenerator(
    exportSet, ica.GetDestination().c_str(), ica.GetPermissions().c_str(),
    ica.GetConfigurations(), ica.GetComponent().c_str(), message,
    ica.GetExcludeFromAll(), fname.c_str(), name_space.GetCString(),
    exportOld.IsEnabled(), true);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
#else
  static_cast<void>(args);
  this->SetError("EXPORT_ANDROID_MK not supported in bootstrap cmake");
  return false;
#endif
}